

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O0

Adjacency_Graph<false> * Disa::create_graph_saad(void)

{
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  Adjacency_Graph<false> *in_RDI;
  int local_2f0 [60];
  pair<unsigned_long,_unsigned_long> local_200;
  pair<unsigned_long,_unsigned_long> pStack_1f0;
  pair<unsigned_long,_unsigned_long> pStack_1e0;
  pair<unsigned_long,_unsigned_long> pStack_1d0;
  pair<unsigned_long,_unsigned_long> pStack_1c0;
  pair<unsigned_long,_unsigned_long> pStack_1b0;
  pair<unsigned_long,_unsigned_long> pStack_1a0;
  pair<unsigned_long,_unsigned_long> pStack_190;
  pair<unsigned_long,_unsigned_long> pStack_180;
  pair<unsigned_long,_unsigned_long> pStack_170;
  pair<unsigned_long,_unsigned_long> pStack_160;
  pair<unsigned_long,_unsigned_long> pStack_150;
  pair<unsigned_long,_unsigned_long> pStack_140;
  pair<unsigned_long,_unsigned_long> pStack_130;
  pair<unsigned_long,_unsigned_long> pStack_120;
  pair<unsigned_long,_unsigned_long> pStack_110;
  pair<unsigned_long,_unsigned_long> pStack_100;
  pair<unsigned_long,_unsigned_long> pStack_f0;
  pair<unsigned_long,_unsigned_long> pStack_e0;
  pair<unsigned_long,_unsigned_long> pStack_d0;
  pair<unsigned_long,_unsigned_long> pStack_c0;
  pair<unsigned_long,_unsigned_long> pStack_b0;
  pair<unsigned_long,_unsigned_long> pStack_a0;
  pair<unsigned_long,_unsigned_long> pStack_90;
  pair<unsigned_long,_unsigned_long> pStack_80;
  pair<unsigned_long,_unsigned_long> pStack_70;
  pair<unsigned_long,_unsigned_long> pStack_60;
  pair<unsigned_long,_unsigned_long> pStack_50;
  pair<unsigned_long,_unsigned_long> pStack_40;
  pair<unsigned_long,_unsigned_long> pStack_30;
  iterator local_20;
  undefined8 local_18;
  
  local_2f0[0x3b] = 0;
  local_2f0[0x3a] = 6;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_200,local_2f0 + 0x3b,local_2f0 + 0x3a);
  local_2f0[0x39] = 0;
  local_2f0[0x38] = 8;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_1f0,local_2f0 + 0x39,local_2f0 + 0x38);
  local_2f0[0x37] = 1;
  local_2f0[0x36] = 7;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_1e0,local_2f0 + 0x37,local_2f0 + 0x36);
  local_2f0[0x35] = 1;
  local_2f0[0x34] = 8;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_1d0,local_2f0 + 0x35,local_2f0 + 0x34);
  local_2f0[0x33] = 1;
  local_2f0[0x32] = 10;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_1c0,local_2f0 + 0x33,local_2f0 + 0x32);
  local_2f0[0x31] = 1;
  local_2f0[0x30] = 0xc;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_1b0,local_2f0 + 0x31,local_2f0 + 0x30);
  local_2f0[0x2f] = 2;
  local_2f0[0x2e] = 6;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_1a0,local_2f0 + 0x2f,local_2f0 + 0x2e);
  local_2f0[0x2d] = 2;
  local_2f0[0x2c] = 7;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_190,local_2f0 + 0x2d,local_2f0 + 0x2c);
  local_2f0[0x2b] = 2;
  local_2f0[0x2a] = 9;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_180,local_2f0 + 0x2b,local_2f0 + 0x2a);
  local_2f0[0x29] = 3;
  local_2f0[0x28] = 0xb;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_170,local_2f0 + 0x29,local_2f0 + 0x28);
  local_2f0[0x27] = 3;
  local_2f0[0x26] = 0xc;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_160,local_2f0 + 0x27,local_2f0 + 0x26);
  local_2f0[0x25] = 3;
  local_2f0[0x24] = 0xe;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_150,local_2f0 + 0x25,local_2f0 + 0x24);
  local_2f0[0x23] = 4;
  local_2f0[0x22] = 9;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_140,local_2f0 + 0x23,local_2f0 + 0x22);
  local_2f0[0x21] = 4;
  local_2f0[0x20] = 10;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_130,local_2f0 + 0x21,local_2f0 + 0x20);
  local_2f0[0x1f] = 4;
  local_2f0[0x1e] = 0xb;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_120,local_2f0 + 0x1f,local_2f0 + 0x1e);
  local_2f0[0x1d] = 4;
  local_2f0[0x1c] = 0xd;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_110,local_2f0 + 0x1d,local_2f0 + 0x1c);
  local_2f0[0x1b] = 5;
  local_2f0[0x1a] = 0xd;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_100,local_2f0 + 0x1b,local_2f0 + 0x1a);
  local_2f0[0x19] = 5;
  local_2f0[0x18] = 0xe;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_f0,local_2f0 + 0x19,local_2f0 + 0x18);
  local_2f0[0x17] = 6;
  local_2f0[0x16] = 7;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_e0,local_2f0 + 0x17,local_2f0 + 0x16);
  local_2f0[0x15] = 6;
  local_2f0[0x14] = 8;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_d0,local_2f0 + 0x15,local_2f0 + 0x14);
  local_2f0[0x13] = 7;
  local_2f0[0x12] = 8;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_c0,local_2f0 + 0x13,local_2f0 + 0x12);
  local_2f0[0x11] = 7;
  local_2f0[0x10] = 9;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_b0,local_2f0 + 0x11,local_2f0 + 0x10);
  local_2f0[0xf] = 7;
  local_2f0[0xe] = 10;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_a0,local_2f0 + 0xf,local_2f0 + 0xe);
  local_2f0[0xd] = 9;
  local_2f0[0xc] = 10;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_90,local_2f0 + 0xd,local_2f0 + 0xc);
  local_2f0[0xb] = 10;
  local_2f0[10] = 0xb;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_80,local_2f0 + 0xb,local_2f0 + 10);
  local_2f0[9] = 10;
  local_2f0[8] = 0xc;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_70,local_2f0 + 9,local_2f0 + 8);
  local_2f0[7] = 0xb;
  local_2f0[6] = 0xc;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_60,local_2f0 + 7,local_2f0 + 6);
  local_2f0[5] = 0xb;
  local_2f0[4] = 0xd;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_50,local_2f0 + 5,local_2f0 + 4);
  local_2f0[3] = 0xb;
  local_2f0[2] = 0xe;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&pStack_40,local_2f0 + 3,local_2f0 + 2);
  local_2f0[1] = 0xd;
  local_2f0[0] = 0xe;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&pStack_30,local_2f0 + 1,local_2f0);
  local_20 = &local_200;
  local_18 = 0x1e;
  edge_graph._M_len = 0x1e;
  edge_graph._M_array = local_20;
  Adjacency_Graph<false>::Adjacency_Graph(in_RDI,edge_graph);
  return in_RDI;
}

Assistant:

inline Adjacency_Graph<false> create_graph_saad() {
  return Adjacency_Graph<false>({{0, 6},   {0, 8},   {1, 7},   {1, 8},   {1, 10},  {1, 12}, {2, 6},  {2, 7},
                                 {2, 9},   {3, 11},  {3, 12},  {3, 14},  {4, 9},   {4, 10}, {4, 11}, {4, 13},
                                 {5, 13},  {5, 14},  {6, 7},   {6, 8},   {7, 8},   {7, 9},  {7, 10}, {9, 10},
                                 {10, 11}, {10, 12}, {11, 12}, {11, 13}, {11, 14}, {13, 14}});
}